

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool SubtractionHelper<int,_unsigned_long,_10>::Subtract(int *lhs,unsigned_long *rhs,int *result)

{
  ulong uVar1;
  uint32_t uVar2;
  int *in_RDX;
  ulong *in_RSI;
  int *in_RDI;
  uint64_t AbsMinIntT;
  
  if (*in_RDI < 0) {
    uVar1 = *in_RSI;
    uVar2 = AbsValueHelper<int,_0>::Abs(0);
    if (uVar1 <= 0x80000000 - (ulong)uVar2) {
      *in_RDX = *in_RDI - (int)*in_RSI;
      return true;
    }
  }
  else if (*in_RSI <= (long)*in_RDI + 0x80000000U) {
    *in_RDX = *in_RDI - (int)*in_RSI;
    return true;
  }
  return false;
}

Assistant:

static bool Subtract( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // lhs is any signed int, rhs unsigned int64
        // check against available range

        // We need the absolute value of std::numeric_limits<T>::min()
        // This will give it to us without extraneous compiler warnings
        const std::uint64_t AbsMinIntT = (std::uint64_t)std::numeric_limits<T>::max() + 1;

        if( lhs < 0 )
        {
            if( rhs <= AbsMinIntT - AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( lhs ) )
            {
                result = (T)( lhs - rhs );
                return true;
            }
        }
        else
        {
            if( rhs <= AbsMinIntT + (std::uint64_t)lhs )
            {
                result = (T)( lhs - rhs );
                return true;
            }
        }

        return false;
    }